

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatawidgetmapper.cpp
# Opt level: O0

void __thiscall QDataWidgetMapper::clearMapping(QDataWidgetMapper *this)

{
  long lVar1;
  bool bVar2;
  QDataWidgetMapperPrivate *__x;
  QWidget *pQVar3;
  vector<QDataWidgetMapperPrivate::WidgetMapper,_std::allocator<QDataWidgetMapperPrivate::WidgetMapper>_>
  *in_RDI;
  long in_FS_OFFSET;
  QDataWidgetMapperPrivate *d;
  const_reverse_iterator end;
  const_reverse_iterator it;
  vector<QDataWidgetMapperPrivate::WidgetMapper,_std::allocator<QDataWidgetMapperPrivate::WidgetMapper>_>
  copy;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_QDataWidgetMapperPrivate::WidgetMapper_*,_std::vector<QDataWidgetMapperPrivate::WidgetMapper,_std::allocator<QDataWidgetMapperPrivate::WidgetMapper>_>_>_>
  *in_stack_ffffffffffffffb8;
  vector<QDataWidgetMapperPrivate::WidgetMapper,_std::allocator<QDataWidgetMapperPrivate::WidgetMapper>_>
  *in_stack_ffffffffffffffd0;
  vector<QDataWidgetMapperPrivate::WidgetMapper,_std::allocator<QDataWidgetMapperPrivate::WidgetMapper>_>
  *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __x = d_func((QDataWidgetMapper *)0x870c05);
  std::
  vector<QDataWidgetMapperPrivate::WidgetMapper,_std::allocator<QDataWidgetMapperPrivate::WidgetMapper>_>
  ::vector((vector<QDataWidgetMapperPrivate::WidgetMapper,_std::allocator<QDataWidgetMapperPrivate::WidgetMapper>_>
            *)0x870c38);
  std::
  vector<QDataWidgetMapperPrivate::WidgetMapper,_std::allocator<QDataWidgetMapperPrivate::WidgetMapper>_>
  ::swap(in_stack_ffffffffffffffd0,in_RDI);
  std::
  vector<QDataWidgetMapperPrivate::WidgetMapper,_std::allocator<QDataWidgetMapperPrivate::WidgetMapper>_>
  ::crbegin(in_RDI);
  this_00 = (vector<QDataWidgetMapperPrivate::WidgetMapper,_std::allocator<QDataWidgetMapperPrivate::WidgetMapper>_>
             *)&DAT_aaaaaaaaaaaaaaaa;
  std::
  vector<QDataWidgetMapperPrivate::WidgetMapper,_std::allocator<QDataWidgetMapperPrivate::WidgetMapper>_>
  ::crend(in_RDI);
  while (bVar2 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<const_QDataWidgetMapperPrivate::WidgetMapper_*,_std::vector<QDataWidgetMapperPrivate::WidgetMapper,_std::allocator<QDataWidgetMapperPrivate::WidgetMapper>_>_>_>
                                  *)__x,in_stack_ffffffffffffffb8), bVar2) {
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<const_QDataWidgetMapperPrivate::WidgetMapper_*,_std::vector<QDataWidgetMapperPrivate::WidgetMapper,_std::allocator<QDataWidgetMapperPrivate::WidgetMapper>_>_>_>
    ::operator->(in_stack_ffffffffffffffb8);
    bVar2 = ::QPointer::operator_cast_to_bool((QPointer<QWidget> *)0x870cab);
    if (bVar2) {
      std::
      reverse_iterator<__gnu_cxx::__normal_iterator<const_QDataWidgetMapperPrivate::WidgetMapper_*,_std::vector<QDataWidgetMapperPrivate::WidgetMapper,_std::allocator<QDataWidgetMapperPrivate::WidgetMapper>_>_>_>
      ::operator->(in_stack_ffffffffffffffb8);
      pQVar3 = QPointer<QWidget>::operator->((QPointer<QWidget> *)0x870cc3);
      QObject::removeEventFilter(&pQVar3->super_QObject);
    }
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<const_QDataWidgetMapperPrivate::WidgetMapper_*,_std::vector<QDataWidgetMapperPrivate::WidgetMapper,_std::allocator<QDataWidgetMapperPrivate::WidgetMapper>_>_>_>
    ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<const_QDataWidgetMapperPrivate::WidgetMapper_*,_std::vector<QDataWidgetMapperPrivate::WidgetMapper,_std::allocator<QDataWidgetMapperPrivate::WidgetMapper>_>_>_>
                  *)__x);
  }
  std::
  vector<QDataWidgetMapperPrivate::WidgetMapper,_std::allocator<QDataWidgetMapperPrivate::WidgetMapper>_>
  ::~vector(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QDataWidgetMapper::clearMapping()
{
    Q_D(QDataWidgetMapper);

    decltype(d->widgetMap) copy;
    d->widgetMap.swap(copy); // a C++98 move
    for (auto it = copy.crbegin(), end = copy.crend(); it != end; ++it) {
        if (it->widget)
            it->widget->removeEventFilter(d->delegate);
    }
}